

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O1

void stringcap(luaL_Buffer *b,CapState *cs)

{
  char cVar1;
  lua_State *L;
  size_t sVar2;
  char *s;
  Capture *pCVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  size_t len;
  StrAux cps [10];
  ulong local_130;
  undefined1 local_128 [8];
  undefined1 auStack_120 [240];
  
  L = cs->L;
  iVar6 = updatecache(cs,(uint)cs->cap->idx);
  pcVar8 = lua_tolstring(L,iVar6,&local_130);
  iVar6 = getstrcaps(cs,(StrAux *)local_128,0);
  if (local_130 != 0) {
    uVar10 = 0;
    do {
      if (pcVar8[uVar10] == '%') {
        lVar4 = uVar10 + 1;
        uVar10 = uVar10 + 1;
        if ((byte)(pcVar8[lVar4] - 0x3aU) < 0xf6) goto LAB_001292c4;
        bVar5 = pcVar8[lVar4] - 0x30;
        uVar9 = (uint)bVar5;
        if ((int)(uint)bVar5 < iVar6) {
          if (((StrAux *)local_128)[uVar9].isstring == 0) {
            pCVar3 = cs->cap;
            cs->cap = ((StrAux *)local_128)[uVar9].u.cp;
            iVar7 = addonestring(b,cs,"capture");
            if (iVar7 == 0) {
              luaL_error(cs->L,"no values in capture index %d",(ulong)uVar9);
            }
            cs->cap = pCVar3;
          }
          else {
            s = ((StrAux *)local_128)[uVar9].u.s.s;
            luaL_addlstring(b,s,(long)((StrAux *)local_128)[uVar9].u.s.e - (long)s);
          }
        }
        else {
          luaL_error(cs->L,"invalid capture index (%d)",(ulong)uVar9);
        }
      }
      else {
LAB_001292c4:
        if (b->size <= b->n) {
          luaL_prepbuffsize(b,1);
        }
        cVar1 = pcVar8[uVar10];
        sVar2 = b->n;
        b->n = sVar2 + 1;
        b->b[sVar2] = cVar1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < local_130);
  }
  return;
}

Assistant:

static void stringcap (luaL_Buffer *b, CapState *cs) {
  StrAux cps[MAXSTRCAPS];
  int n;
  size_t len, i;
  const char *fmt;  /* format string */
  fmt = lua_tolstring(cs->L, updatecache(cs, cs->cap->idx), &len);
  n = getstrcaps(cs, cps, 0) - 1;  /* collect nested captures */
  for (i = 0; i < len; i++) {  /* traverse them */
    if (fmt[i] != '%')  /* not an escape? */
      luaL_addchar(b, fmt[i]);  /* add it to buffer */
    else if (fmt[++i] < '0' || fmt[i] > '9')  /* not followed by a digit? */
      luaL_addchar(b, fmt[i]);  /* add to buffer */
    else {
      int l = fmt[i] - '0';  /* capture index */
      if (l > n)
        luaL_error(cs->L, "invalid capture index (%d)", l);
      else if (cps[l].isstring)
        luaL_addlstring(b, cps[l].u.s.s, cps[l].u.s.e - cps[l].u.s.s);
      else {
        Capture *curr = cs->cap;
        cs->cap = cps[l].u.cp;  /* go back to evaluate that nested capture */
        if (!addonestring(b, cs, "capture"))
          luaL_error(cs->L, "no values in capture index %d", l);
        cs->cap = curr;  /* continue from where it stopped */
      }
    }
  }
}